

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_subtree
                 (lyd_node *root,ly_set *node_when,ly_set *node_types,ly_set *meta_types,
                 ly_set *ext_node,ly_set *ext_val,uint32_t val_opts,uint32_t int_opts,
                 ly_ht *getnext_ht,lyd_node **diff)

{
  ushort uVar1;
  lyd_meta *object;
  lysc_node *plVar2;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lyd_node **pplVar5;
  lysc_when *plVar6;
  lyd_node_inner *plVar7;
  lyd_node_inner *sibling;
  lyd_meta **pplVar8;
  lysc_type *type;
  
  LVar4 = LY_SUCCESS;
  plVar7 = (lyd_node_inner *)root;
  do {
    sibling = plVar7;
    if (sibling == (lyd_node_inner *)0x0) {
      return LVar4;
    }
    if ((undefined1  [56])((undefined1  [56])sibling->field_0 & (undefined1  [56])0x800000000) !=
        (undefined1  [56])0x0) {
      LVar4 = lyd_validate_nested_ext((lyd_node *)sibling,ext_val);
      return LVar4;
    }
    if ((sibling->field_0).node.schema != (lysc_node *)0x0) {
      pplVar8 = &(sibling->field_0).node.meta;
      while (object = *pplVar8, object != (lyd_meta *)0x0) {
        lyplg_ext_get_storage(object->annotation,0x2e0000,8,&type);
        if ((type->plugin->validate != (lyplg_type_validate_clb)0x0) &&
           (LVar3 = ly_set_add(meta_types,object,'\x01',(uint32_t *)0x0), LVar3 != LY_SUCCESS)) {
          return LVar3;
        }
        pplVar8 = &object->next;
      }
      plVar2 = (sibling->field_0).node.schema;
      uVar1 = plVar2->nodetype;
      if (((uVar1 & 0xc) == 0) || ((plVar2[1].parent)->parent->parent == (lysc_node *)0x0)) {
        if ((uVar1 & 0x711) != 0) {
          pplVar5 = lyd_node_child_p((lyd_node *)sibling);
          LVar3 = lyd_validate_new(pplVar5,(sibling->field_0).node.schema,(lys_module *)0x0,
                                   (lysc_ext_instance *)0x0,val_opts,int_opts,getnext_ht,diff);
          if (LVar3 != LY_SUCCESS) {
            if (LVar3 != LY_EVALID) {
              return LVar3;
            }
            LVar4 = LY_EVALID;
            if ((val_opts & 4) == 0) {
              return LY_EVALID;
            }
          }
          pplVar5 = lyd_node_child_p((lyd_node *)sibling);
          LVar3 = lyd_new_implicit((lyd_node *)sibling,pplVar5,(lysc_node *)0x0,(lys_module *)0x0,
                                   (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,
                                   val_opts >> 1 & 8 | val_opts & 1,getnext_ht,diff);
          goto LAB_001aa2fe;
        }
      }
      else {
        LVar3 = ly_set_add(node_types,sibling,'\x01',(uint32_t *)0x0);
LAB_001aa2fe:
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
      }
      plVar6 = lysc_has_when((sibling->field_0).node.schema);
      if ((plVar6 != (lysc_when *)0x0) &&
         (LVar3 = ly_set_add(node_when,sibling,'\x01',(uint32_t *)0x0), LVar3 != LY_SUCCESS)) {
        return LVar3;
      }
      LVar3 = lyd_validate_node_ext((lyd_node *)sibling,ext_node);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    plVar7 = (lyd_node_inner *)lyd_child((lyd_node *)sibling);
    if (plVar7 == (lyd_node_inner *)0x0) {
      if (sibling != (lyd_node_inner *)root) goto LAB_001aa359;
      return LVar4;
    }
    while ((plVar7 == (lyd_node_inner *)0x0 &&
           (sibling = (sibling->field_0).node.parent, (sibling->field_0).node.parent != root->parent
           ))) {
LAB_001aa359:
      plVar7 = (lyd_node_inner *)(sibling->field_0).node.next;
    }
  } while( true );
}

Assistant:

static LY_ERR
lyd_validate_subtree(struct lyd_node *root, struct ly_set *node_when, struct ly_set *node_types,
        struct ly_set *meta_types, struct ly_set *ext_node, struct ly_set *ext_val, uint32_t val_opts,
        uint32_t int_opts, struct ly_ht *getnext_ht, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lyd_meta *meta;
    const struct lysc_type *type;
    struct lyd_node *node;
    uint32_t impl_opts;

    LYD_TREE_DFS_BEGIN(root, node) {
        if (node->flags & LYD_EXT) {
            /* validate using the extension instance callback */
            return lyd_validate_nested_ext(node, ext_val);
        }

        if (!node->schema) {
            /* do not validate opaque nodes */
            goto next_node;
        }

        LY_LIST_FOR(node->meta, meta) {
            lyplg_ext_get_storage(meta->annotation, LY_STMT_TYPE, sizeof type, (const void **)&type);
            if (type->plugin->validate) {
                /* metadata type resolution */
                r = ly_set_add(meta_types, (void *)meta, 1, NULL);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            }
        }

        if ((node->schema->nodetype & LYD_NODE_TERM) && ((struct lysc_node_leaf *)node->schema)->type->plugin->validate) {
            /* node type resolution */
            r = ly_set_add(node_types, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else if (node->schema->nodetype & LYD_NODE_INNER) {
            /* new node validation, autodelete */
            r = lyd_validate_new(lyd_node_child_p(node), node->schema, NULL, NULL, val_opts, int_opts, getnext_ht, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* add nested defaults */
            impl_opts = 0;
            if (val_opts & LYD_VALIDATE_NO_STATE) {
                impl_opts |= LYD_IMPLICIT_NO_STATE;
            }
            if (val_opts & LYD_VALIDATE_NO_DEFAULTS) {
                impl_opts |= LYD_IMPLICIT_NO_DEFAULTS;
            }
            r = lyd_new_implicit(node, lyd_node_child_p(node), NULL, NULL, NULL, NULL, NULL, impl_opts, getnext_ht, diff);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        if (lysc_has_when(node->schema)) {
            /* when evaluation */
            r = ly_set_add(node_when, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        /* store for ext instance node validation, if needed */
        r = lyd_validate_node_ext(node, ext_node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

next_node:
        LYD_TREE_DFS_END(root, node);
    }

cleanup:
    return rc;
}